

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_next_global(REF_NODE ref_node,REF_GLOB *global)

{
  int iVar1;
  
  iVar1 = ref_node->n_unused;
  if ((long)iVar1 < 1) {
    if (ref_node->new_n_global == -1) {
      ref_node->old_n_global = (long)ref_node->n;
      ref_node->new_n_global = (long)ref_node->n;
    }
    *global = ref_node->new_n_global;
    ref_node->new_n_global = ref_node->new_n_global + 1;
  }
  else {
    ref_node->n_unused = iVar1 + -1;
    *global = ref_node->unused_global[(long)iVar1 + -1];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_next_global(REF_NODE ref_node, REF_GLOB *global) {
  if (0 < ref_node_n_unused(ref_node)) {
    RSS(ref_node_pop_unused(ref_node, global),
        "grab an unused global from list");
  } else {
    if (REF_EMPTY == ref_node->new_n_global)
      RSS(ref_node_initialize_n_global(ref_node, ref_node_n(ref_node)),
          "init with n");
    (*global) = ref_node->new_n_global;
    (ref_node->new_n_global)++;
  }

  return REF_SUCCESS;
}